

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O3

int run_test_semaphore_3(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_sem_t *loop;
  uv_loop_t *puVar2;
  uv_sem_t *unaff_RBX;
  int iVar3;
  uv_tcp_t *puVar4;
  uv_pipe_t *handle;
  uv_connect_t *loop_00;
  uv_sem_t sem;
  uv_pipe_t uStack_258;
  uv_loop_t *puStack_150;
  code *pcStack_148;
  sockaddr_in sStack_138;
  uv_tcp_t uStack_128;
  uv_loop_t *puStack_30;
  uv_sem_t uStack_28;
  
  loop = &uStack_28;
  puStack_30 = (uv_loop_t *)0x167a82;
  iVar1 = uv_sem_init(&uStack_28,3);
  if (iVar1 == 0) {
    puStack_30 = (uv_loop_t *)0x167a91;
    uv_sem_wait(&uStack_28);
    puStack_30 = (uv_loop_t *)0x167a99;
    uv_sem_wait(&uStack_28);
    puStack_30 = (uv_loop_t *)0x167aa1;
    iVar1 = uv_sem_trywait(&uStack_28);
    unaff_RBX = &uStack_28;
    if (iVar1 != 0) goto LAB_00167aeb;
    puStack_30 = (uv_loop_t *)0x167aad;
    iVar1 = uv_sem_trywait(&uStack_28);
    unaff_RBX = &uStack_28;
    if (iVar1 != -0xb) goto LAB_00167af0;
    puStack_30 = (uv_loop_t *)0x167abd;
    uv_sem_post(&uStack_28);
    puStack_30 = (uv_loop_t *)0x167ac5;
    iVar1 = uv_sem_trywait(&uStack_28);
    if (iVar1 != 0) goto LAB_00167af5;
    puStack_30 = (uv_loop_t *)0x167ad1;
    iVar1 = uv_sem_trywait(&uStack_28);
    loop = &uStack_28;
    if (iVar1 == -0xb) {
      puStack_30 = (uv_loop_t *)0x167ade;
      uv_sem_destroy(&uStack_28);
      return 0;
    }
  }
  else {
    puStack_30 = (uv_loop_t *)0x167aeb;
    run_test_semaphore_3_cold_1();
LAB_00167aeb:
    puStack_30 = (uv_loop_t *)0x167af0;
    run_test_semaphore_3_cold_2();
LAB_00167af0:
    loop = unaff_RBX;
    puStack_30 = (uv_loop_t *)0x167af5;
    run_test_semaphore_3_cold_3();
LAB_00167af5:
    puStack_30 = (uv_loop_t *)0x167afa;
    run_test_semaphore_3_cold_4();
  }
  puStack_30 = (uv_loop_t *)0x167aff;
  run_test_semaphore_3_cold_5();
  loop_00 = (uv_connect_t *)0x1a4b3a;
  iVar3 = 0x23a3;
  pcStack_148 = (code *)0x167b1e;
  puStack_30 = (uv_loop_t *)loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_138);
  if (iVar1 == 0) {
    pcStack_148 = (code *)0x167b2b;
    loop_00 = (uv_connect_t *)uv_default_loop();
    puVar4 = &uStack_128;
    pcStack_148 = (code *)0x167b38;
    iVar1 = uv_tcp_init((uv_loop_t *)loop_00,puVar4);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00167bd3;
    loop_00 = &connect_req;
    puVar4 = &uStack_128;
    pcStack_148 = (code *)0x167b5d;
    iVar1 = uv_tcp_connect(&connect_req,puVar4,(sockaddr *)&sStack_138,connect_cb);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00167bd8;
    pcStack_148 = (code *)0x167b66;
    loop_00 = (uv_connect_t *)uv_default_loop();
    iVar3 = 0;
    pcStack_148 = (code *)0x167b70;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00167bdd;
    if (connect_cb_called != 1) goto LAB_00167be2;
    if (shutdown_cb_called != 1) goto LAB_00167be7;
    if (close_cb_called != 1) goto LAB_00167bec;
    pcStack_148 = (code *)0x167b94;
    loop = (uv_sem_t *)uv_default_loop();
    pcStack_148 = (code *)0x167ba8;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    pcStack_148 = (code *)0x167bb2;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    pcStack_148 = (code *)0x167bb7;
    loop_00 = (uv_connect_t *)uv_default_loop();
    pcStack_148 = (code *)0x167bbf;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_148 = (code *)0x167bd3;
    run_test_shutdown_close_tcp_cold_1();
LAB_00167bd3:
    pcStack_148 = (code *)0x167bd8;
    run_test_shutdown_close_tcp_cold_2();
LAB_00167bd8:
    pcStack_148 = (code *)0x167bdd;
    run_test_shutdown_close_tcp_cold_3();
LAB_00167bdd:
    pcStack_148 = (code *)0x167be2;
    run_test_shutdown_close_tcp_cold_4();
LAB_00167be2:
    pcStack_148 = (code *)0x167be7;
    run_test_shutdown_close_tcp_cold_5();
LAB_00167be7:
    pcStack_148 = (code *)0x167bec;
    run_test_shutdown_close_tcp_cold_6();
LAB_00167bec:
    pcStack_148 = (code *)0x167bf1;
    run_test_shutdown_close_tcp_cold_7();
  }
  pcStack_148 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (loop_00 == &connect_req) {
    if (iVar3 != 0) goto LAB_00167c66;
    puStack_150 = (uv_loop_t *)0x167c21;
    pcStack_148._0_4_ = extraout_EAX;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    if (iVar1 != 0) goto LAB_00167c6b;
    puStack_150 = (uv_loop_t *)0x167c31;
    iVar1 = uv_is_closing((uv_handle_t *)connect_req.handle);
    if (iVar1 != 0) goto LAB_00167c70;
    puStack_150 = (uv_loop_t *)0x167c48;
    uv_close((uv_handle_t *)connect_req.handle,close_cb);
    puStack_150 = (uv_loop_t *)0x167c54;
    iVar1 = uv_is_closing((uv_handle_t *)connect_req.handle);
    if (iVar1 == 1) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_148;
    }
  }
  else {
    puStack_150 = (uv_loop_t *)0x167c66;
    connect_cb_cold_1();
LAB_00167c66:
    puStack_150 = (uv_loop_t *)0x167c6b;
    connect_cb_cold_2();
LAB_00167c6b:
    puStack_150 = (uv_loop_t *)0x167c70;
    connect_cb_cold_3();
LAB_00167c70:
    puStack_150 = (uv_loop_t *)0x167c75;
    connect_cb_cold_4();
  }
  puStack_150 = (uv_loop_t *)run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  puStack_150 = (uv_loop_t *)loop;
  puVar2 = uv_default_loop();
  handle = &uStack_258;
  iVar1 = uv_pipe_init(puVar2,handle,0);
  iVar3 = (int)handle;
  if (iVar1 == 0) {
    uv_pipe_connect(&connect_req,&uStack_258,"/tmp/uv-test-sock",connect_cb);
    puVar2 = uv_default_loop();
    iVar3 = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00167d2f;
    if (connect_cb_called != 1) goto LAB_00167d34;
    if (shutdown_cb_called != 1) goto LAB_00167d39;
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00167d43;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_00167d2f:
    run_test_shutdown_close_pipe_cold_2();
LAB_00167d34:
    run_test_shutdown_close_pipe_cold_3();
LAB_00167d39:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_00167d43:
  run_test_shutdown_close_pipe_cold_6();
  if (puVar2 == (uv_loop_t *)&shutdown_req) {
    if ((iVar3 == -0x7d) || (iVar3 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT(0 == uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT(0 == uv_sem_trywait(&sem));
  ASSERT(UV_EAGAIN == uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}